

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layernorm.cpp
# Opt level: O0

int __thiscall ncnn::LayerNorm::forward_inplace(LayerNorm *this,Mat *bottom_top_blob,Option *opt)

{
  int iVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  long *in_RSI;
  long lVar5;
  long in_RDI;
  float fVar6;
  float fVar7;
  int i_9;
  int i_8;
  float b_3;
  float a_3;
  float var_3;
  int i_7;
  float tmp_3;
  float mean_3;
  int i_6;
  float sqsum_3;
  float sum_3;
  float *ptr_3;
  int q_1;
  int j_7;
  int j_6;
  float b_2;
  float a_2;
  float var_2;
  int j_5;
  float tmp_2;
  float mean_2;
  int j_4;
  float sqsum_2;
  float sum_2;
  float *ptr_2;
  int i_5;
  int q;
  int size;
  int channels;
  int h_1;
  int w_2;
  int j_3;
  int j_2;
  float b_1;
  float a_1;
  float var_1;
  int j_1;
  float tmp_1;
  float mean_1;
  int j;
  float sqsum_1;
  float sum_1;
  float *ptr_1;
  int i_4;
  int h;
  int w_1;
  int i_3;
  int i_2;
  float b;
  float a;
  float var;
  int i_1;
  float tmp;
  float mean;
  int i;
  float sqsum;
  float sum;
  float *ptr;
  int w;
  int dims;
  Mat *m_1;
  Mat *m;
  int local_3ec;
  int local_3e8;
  int local_3d8;
  int local_3cc;
  float local_3c8;
  float local_3c4;
  int local_36c;
  int local_368;
  int local_364;
  int local_354;
  int local_348;
  float local_344;
  float local_340;
  int local_2dc;
  int local_2d8;
  int local_2c4;
  int local_2c0;
  int local_2b0;
  int local_2a4;
  float local_2a0;
  float local_29c;
  int local_290;
  int local_284;
  int local_280;
  int local_270;
  int local_264;
  float local_260;
  float local_25c;
  
  iVar1 = (int)in_RSI[5];
  if (iVar1 == 1) {
    iVar4 = *(int *)((long)in_RSI + 0x2c);
    lVar5 = *in_RSI;
    local_25c = 0.0;
    local_260 = 0.0;
    for (local_264 = 0; local_264 < iVar4; local_264 = local_264 + 1) {
      local_25c = *(float *)(lVar5 + (long)local_264 * 4) + local_25c;
    }
    for (local_270 = 0; local_270 < iVar4; local_270 = local_270 + 1) {
      fVar6 = *(float *)(lVar5 + (long)local_270 * 4) - local_25c / (float)iVar4;
      local_260 = fVar6 * fVar6 + local_260;
    }
    fVar6 = 1.0 / SQRT(local_260 / (float)iVar4 + *(float *)(in_RDI + 0xd4));
    fVar7 = -(local_25c / (float)iVar4) * fVar6;
    if (*(int *)(in_RDI + 0xd8) == 0) {
      for (local_284 = 0; local_284 < iVar4; local_284 = local_284 + 1) {
        *(float *)(lVar5 + (long)local_284 * 4) =
             *(float *)(lVar5 + (long)local_284 * 4) * fVar6 + fVar7;
      }
    }
    else {
      for (local_280 = 0; local_280 < iVar4; local_280 = local_280 + 1) {
        *(float *)(lVar5 + (long)local_280 * 4) =
             (*(float *)(lVar5 + (long)local_280 * 4) * fVar6 + fVar7) *
             *(float *)(*(long *)(in_RDI + 0xe0) + (long)local_280 * 4) +
             *(float *)(*(long *)(in_RDI + 0x128) + (long)local_280 * 4);
      }
    }
  }
  if (iVar1 == 2) {
    iVar4 = *(int *)((long)in_RSI + 0x2c);
    lVar5 = in_RSI[6];
    for (local_290 = 0; local_290 < (int)lVar5; local_290 = local_290 + 1) {
      lVar2 = *in_RSI + (long)*(int *)((long)in_RSI + 0x2c) * (long)local_290 * in_RSI[2];
      local_29c = 0.0;
      local_2a0 = 0.0;
      for (local_2a4 = 0; local_2a4 < iVar4; local_2a4 = local_2a4 + 1) {
        local_29c = *(float *)(lVar2 + (long)local_2a4 * 4) + local_29c;
      }
      for (local_2b0 = 0; local_2b0 < iVar4; local_2b0 = local_2b0 + 1) {
        fVar6 = *(float *)(lVar2 + (long)local_2b0 * 4) - local_29c / (float)iVar4;
        local_2a0 = fVar6 * fVar6 + local_2a0;
      }
      fVar6 = 1.0 / SQRT(local_2a0 / (float)iVar4 + *(float *)(in_RDI + 0xd4));
      fVar7 = -(local_29c / (float)iVar4) * fVar6;
      if (*(int *)(in_RDI + 0xd8) == 0) {
        for (local_2c4 = 0; local_2c4 < iVar4; local_2c4 = local_2c4 + 1) {
          *(float *)(lVar2 + (long)local_2c4 * 4) =
               *(float *)(lVar2 + (long)local_2c4 * 4) * fVar6 + fVar7;
        }
      }
      else {
        for (local_2c0 = 0; local_2c0 < iVar4; local_2c0 = local_2c0 + 1) {
          *(float *)(lVar2 + (long)local_2c0 * 4) =
               (*(float *)(lVar2 + (long)local_2c0 * 4) * fVar6 + fVar7) *
               *(float *)(*(long *)(in_RDI + 0xe0) + (long)local_2c0 * 4) +
               *(float *)(*(long *)(in_RDI + 0x128) + (long)local_2c0 * 4);
        }
      }
    }
  }
  if (iVar1 == 3) {
    iVar1 = *(int *)((long)in_RSI + 0x2c);
    lVar5 = in_RSI[6];
    lVar2 = in_RSI[7];
    iVar4 = iVar1 * (int)lVar5;
    if (*(int *)(in_RDI + 0xd0) == iVar1) {
      for (local_2d8 = 0; local_2d8 < (int)lVar2; local_2d8 = local_2d8 + 1) {
        for (local_2dc = 0; local_2dc < (int)lVar5; local_2dc = local_2dc + 1) {
          lVar3 = *in_RSI + in_RSI[8] * (long)local_2d8 * in_RSI[2] +
                  (long)*(int *)((long)in_RSI + 0x2c) * (long)local_2dc * in_RSI[2];
          local_340 = 0.0;
          local_344 = 0.0;
          for (local_348 = 0; local_348 < iVar1; local_348 = local_348 + 1) {
            local_340 = *(float *)(lVar3 + (long)local_348 * 4) + local_340;
          }
          for (local_354 = 0; local_354 < iVar1; local_354 = local_354 + 1) {
            fVar6 = *(float *)(lVar3 + (long)local_354 * 4) - local_340 / (float)iVar1;
            local_344 = fVar6 * fVar6 + local_344;
          }
          fVar6 = 1.0 / SQRT(local_344 / (float)iVar1 + *(float *)(in_RDI + 0xd4));
          fVar7 = -(local_340 / (float)iVar1) * fVar6;
          if (*(int *)(in_RDI + 0xd8) == 0) {
            for (local_368 = 0; local_368 < iVar1; local_368 = local_368 + 1) {
              *(float *)(lVar3 + (long)local_368 * 4) =
                   *(float *)(lVar3 + (long)local_368 * 4) * fVar6 + fVar7;
            }
          }
          else {
            for (local_364 = 0; local_364 < iVar1; local_364 = local_364 + 1) {
              *(float *)(lVar3 + (long)local_364 * 4) =
                   (*(float *)(lVar3 + (long)local_364 * 4) * fVar6 + fVar7) *
                   *(float *)(*(long *)(in_RDI + 0xe0) + (long)local_364 * 4) +
                   *(float *)(*(long *)(in_RDI + 0x128) + (long)local_364 * 4);
            }
          }
        }
      }
    }
    else {
      for (local_36c = 0; local_36c < (int)lVar2; local_36c = local_36c + 1) {
        lVar5 = *in_RSI + in_RSI[8] * (long)local_36c * in_RSI[2];
        local_3c4 = 0.0;
        local_3c8 = 0.0;
        for (local_3cc = 0; local_3cc < iVar4; local_3cc = local_3cc + 1) {
          local_3c4 = *(float *)(lVar5 + (long)local_3cc * 4) + local_3c4;
        }
        for (local_3d8 = 0; local_3d8 < iVar4; local_3d8 = local_3d8 + 1) {
          fVar6 = *(float *)(lVar5 + (long)local_3d8 * 4) - local_3c4 / (float)iVar4;
          local_3c8 = fVar6 * fVar6 + local_3c8;
        }
        fVar6 = 1.0 / SQRT(local_3c8 / (float)iVar4 + *(float *)(in_RDI + 0xd4));
        fVar7 = -(local_3c4 / (float)iVar4) * fVar6;
        if (*(int *)(in_RDI + 0xd8) == 0) {
          for (local_3ec = 0; local_3ec < iVar4; local_3ec = local_3ec + 1) {
            *(float *)(lVar5 + (long)local_3ec * 4) =
                 *(float *)(lVar5 + (long)local_3ec * 4) * fVar6 + fVar7;
          }
        }
        else {
          for (local_3e8 = 0; local_3e8 < iVar4; local_3e8 = local_3e8 + 1) {
            *(float *)(lVar5 + (long)local_3e8 * 4) =
                 (*(float *)(lVar5 + (long)local_3e8 * 4) * fVar6 + fVar7) *
                 *(float *)(*(long *)(in_RDI + 0xe0) + (long)local_3e8 * 4) +
                 *(float *)(*(long *)(in_RDI + 0x128) + (long)local_3e8 * 4);
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

int LayerNorm::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    // x = (x - mean) / sqrt(var + eps) * gamma + beta

    int dims = bottom_top_blob.dims;

    if (dims == 1)
    {
        int w = bottom_top_blob.w;
        // assert affine_size == w

        float* ptr = bottom_top_blob;

        // mean and var
        float sum = 0.f;
        float sqsum = 0.f;
        for (int i = 0; i < w; i++)
        {
            sum += ptr[i];
            //sqsum += ptr[i] * ptr[i];
        }
        float mean = sum / w;
        float tmp = 0.f;
        for (int i = 0; i < w; i++)
        {
            tmp = ptr[i] - mean;
            sqsum += tmp * tmp;
        }
        float var = sqsum / w;
        // the var maybe minus due to accuracy
        //float var = sqsum / w - mean * mean;

        float a = 1.f / (sqrtf(var + eps));
        float b = -mean * a;

        if (affine)
        {
            for (int i = 0; i < w; i++)
            {
                ptr[i] = (ptr[i] * a + b) * gamma_data[i] + beta_data[i];
            }
        }
        else
        {
            for (int i = 0; i < w; i++)
            {
                ptr[i] = ptr[i] * a + b;
            }
        }
    }

    if (dims == 2)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        // assert affine_size == w

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; i++)
        {
            float* ptr = bottom_top_blob.row(i);

            // mean and var
            float sum = 0.f;
            float sqsum = 0.f;
            for (int j = 0; j < w; j++)
            {
                sum += ptr[j];
                //sqsum += ptr[j] * ptr[j];
            }
            float mean = sum / w;
            float tmp = 0.f;
            for (int j = 0; j < w; j++)
            {
                tmp = ptr[j] - mean;
                sqsum += tmp * tmp;
            }
            float var = sqsum / w;
            // the var maybe minus due to accuracy
            //float var = sqsum / w - mean * mean;

            float a = 1.f / (sqrtf(var + eps));
            float b = -mean * a;

            if (affine)
            {
                for (int j = 0; j < w; j++)
                {
                    ptr[j] = (ptr[j] * a + b) * gamma_data[j] + beta_data[j];
                }
            }
            else
            {
                for (int j = 0; j < w; j++)
                {
                    ptr[j] = ptr[j] * a + b;
                }
            }
        }
    }

    if (dims == 3)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int channels = bottom_top_blob.c;
        int size = w * h;

        if (affine_size == w)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                for (int i = 0; i < h; i++)
                {
                    float* ptr = bottom_top_blob.channel(q).row(i);

                    // mean and var
                    float sum = 0.f;
                    float sqsum = 0.f;
                    for (int j = 0; j < w; j++)
                    {
                        sum += ptr[j];
                        //sqsum += ptr[j] * ptr[j];
                    }
                    float mean = sum / w;
                    float tmp = 0.f;
                    for (int j = 0; j < w; j++)
                    {
                        tmp = ptr[j] - mean;
                        sqsum += tmp * tmp;
                    }
                    float var = sqsum / w;
                    // the var maybe minus due to accuracy
                    //float var = sqsum / w - mean * mean;

                    float a = 1.f / (sqrtf(var + eps));
                    float b = -mean * a;

                    if (affine)
                    {
                        for (int j = 0; j < w; j++)
                        {
                            ptr[j] = (ptr[j] * a + b) * gamma_data[j] + beta_data[j];
                        }
                    }
                    else
                    {
                        for (int j = 0; j < w; j++)
                        {
                            ptr[j] = ptr[j] * a + b;
                        }
                    }
                }
            }
        }
        else // if (affine_size == size)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                float* ptr = bottom_top_blob.channel(q);

                // mean and var
                float sum = 0.f;
                float sqsum = 0.f;
                for (int i = 0; i < size; i++)
                {
                    sum += ptr[i];
                    //sqsum += ptr[i] * ptr[i];
                }
                float mean = sum / size;
                float tmp = 0.f;
                for (int i = 0; i < size; i++)
                {
                    tmp = ptr[i] - mean;
                    sqsum += tmp * tmp;
                }
                float var = sqsum / size;
                // the var maybe minus due to accuracy
                //float var = sqsum / size - mean * mean;

                float a = 1.f / (sqrtf(var + eps));
                float b = -mean * a;

                if (affine)
                {
                    for (int i = 0; i < size; i++)
                    {
                        ptr[i] = (ptr[i] * a + b) * gamma_data[i] + beta_data[i];
                    }
                }
                else
                {
                    for (int i = 0; i < size; i++)
                    {
                        ptr[i] = ptr[i] * a + b;
                    }
                }
            }
        }
    }

    return 0;
}